

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::saveModel(FastText *this,string *filename)

{
  bool *pbVar1;
  char cVar2;
  invalid_argument *this_00;
  int32_t version;
  int32_t magic;
  ofstream ofs;
  undefined4 local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)filename,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_23c = 0xc;
    local_238._M_dataplus._M_p._0_4_ = 0x2f4f16ba;
    std::ostream::write((char *)&local_218,(long)&local_238);
    std::ostream::write((char *)&local_218,(long)&local_23c);
    Args::save((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ostream *)&local_218);
    Dictionary::save((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&local_218);
    pbVar1 = &this->quant_;
    std::ostream::write((char *)&local_218,(long)pbVar1);
    if (*pbVar1 == true) {
      QMatrix::save((this->qinput_).
                    super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ostream *)&local_218);
    }
    else {
      Matrix::save((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ostream *)&local_218);
    }
    std::ostream::write((char *)&local_218,
                        (long)&((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->qout);
    if ((*pbVar1 == true) &&
       (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true)) {
      QMatrix::save((this->qoutput_).
                    super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ostream *)&local_218);
    }
    else {
      Matrix::save((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ostream *)&local_218);
    }
    std::ofstream::close();
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_238,filename," cannot be opened for saving!");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_238);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveModel(const std::string& filename) {
	std::ofstream ofs(filename, std::ofstream::binary);
	if (!ofs.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for saving!");
	}
	signModel(ofs);
	args_->save(ofs);
	dict_->save(ofs);

	ofs.write((char*)&(quant_), sizeof(bool));
	if (quant_) {
		qinput_->save(ofs);
	} else {
		input_->save(ofs);
	}

	ofs.write((char*)&(args_->qout), sizeof(bool));
	if (quant_ && args_->qout) {
		qoutput_->save(ofs);
	} else {
		output_->save(ofs);
	}

	ofs.close();
}